

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

CURLcode Curl_http2_request_upgrade(dynbuf *req,Curl_easy *data)

{
  CURLcode CVar1;
  size_t insize;
  char *base64;
  size_t blen;
  uint8_t binsettings [80];
  char *local_78;
  size_t local_70;
  uint8_t local_68 [80];
  
  insize = populate_binsettings(local_68,data);
  if ((long)insize < 1) {
    Curl_failf(data,"nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free(req);
    CVar1 = CURLE_FAILED_INIT;
  }
  else {
    CVar1 = Curl_base64url_encode((char *)local_68,insize,&local_78,&local_70);
    if (CVar1 == CURLE_OK) {
      CVar1 = Curl_dyn_addf(req,
                            "Connection: Upgrade, HTTP2-Settings\r\nUpgrade: %s\r\nHTTP2-Settings: %s\r\n"
                            ,"h2c",local_78);
      (*Curl_cfree)(local_78);
      (data->req).upgr101 = UPGR101_H2;
    }
    else {
      Curl_dyn_free(req);
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_http2_request_upgrade(struct dynbuf *req,
                                    struct Curl_easy *data)
{
  CURLcode result;
  char *base64;
  size_t blen;
  struct SingleRequest *k = &data->req;
  uint8_t binsettings[H2_BINSETTINGS_LEN];
  ssize_t binlen; /* length of the binsettings data */

  binlen = populate_binsettings(binsettings, data);
  if(binlen <= 0) {
    failf(data, "nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free(req);
    return CURLE_FAILED_INIT;
  }

  result = Curl_base64url_encode((const char *)binsettings, binlen,
                                 &base64, &blen);
  if(result) {
    Curl_dyn_free(req);
    return result;
  }

  result = Curl_dyn_addf(req,
                         "Connection: Upgrade, HTTP2-Settings\r\n"
                         "Upgrade: %s\r\n"
                         "HTTP2-Settings: %s\r\n",
                         NGHTTP2_CLEARTEXT_PROTO_VERSION_ID, base64);
  free(base64);

  k->upgr101 = UPGR101_H2;

  return result;
}